

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::ConcatOrAlternate
                   (RegexpOp op,Regexp **sub,int nsub,ParseFlags flags,bool can_factor)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  Regexp **ppRVar4;
  Regexp *pRVar5;
  undefined4 in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  int in_EDI;
  undefined1 in_R8B;
  int i_1;
  Regexp **subs;
  Regexp *re;
  int i;
  Regexp **subs_1;
  Regexp *re_2;
  int nbigsub;
  Regexp *re_1;
  Regexp **subcopy;
  ParseFlags in_stack_00000358;
  int in_stack_0000035c;
  Regexp **in_stack_00000360;
  undefined8 in_stack_ffffffffffffff48;
  Regexp *in_stack_ffffffffffffff50;
  int local_7c;
  int local_64;
  undefined8 *local_40;
  undefined1 in_stack_ffffffffffffffd7;
  ParseFlags in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  uint nsub_00;
  RegexpOp op_00;
  Regexp *local_8;
  
  nsub_00 = CONCAT13(in_R8B,in_stack_ffffffffffffffdc) & 0x1ffffff;
  if (in_EDX == 1) {
    local_8 = (Regexp *)*in_RSI;
  }
  else if (in_EDX == 0) {
    if (in_EDI == 6) {
      local_8 = (Regexp *)operator_new(0x28);
      Regexp(in_stack_ffffffffffffff50,(RegexpOp)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (ParseFlags)in_stack_ffffffffffffff48);
    }
    else {
      local_8 = (Regexp *)operator_new(0x28);
      Regexp(in_stack_ffffffffffffff50,(RegexpOp)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (ParseFlags)in_stack_ffffffffffffff48);
    }
  }
  else {
    local_40 = (undefined8 *)0x0;
    if ((in_EDI == 6) && ((char)(nsub_00 >> 0x18) != '\0')) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)in_EDX;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      local_40 = (undefined8 *)operator_new__(uVar3);
      memmove(local_40,in_RSI,(long)in_EDX << 3);
      in_RSI = local_40;
      in_EDX = FactorAlternation(in_stack_00000360,in_stack_0000035c,in_stack_00000358);
      if (in_EDX == 1) {
        pRVar5 = (Regexp *)*in_RSI;
        if (local_40 == (undefined8 *)0x0) {
          return pRVar5;
        }
        operator_delete__(local_40);
        return pRVar5;
      }
    }
    if (in_EDX < 0x10000) {
      local_8 = (Regexp *)operator_new(0x28);
      Regexp(local_8,(RegexpOp)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (ParseFlags)in_stack_ffffffffffffff48);
      AllocSub(local_8,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      ppRVar4 = Regexp::sub(local_8);
      for (local_7c = 0; local_7c < in_EDX; local_7c = local_7c + 1) {
        ppRVar4[local_7c] = (Regexp *)in_RSI[local_7c];
      }
      if (local_40 != (undefined8 *)0x0) {
        operator_delete__(local_40);
      }
    }
    else {
      iVar2 = (int)((ulong)((long)(in_EDX + 0xfffe) * -0x7fff7fff) >> 0x20) + 0xfffe + in_EDX;
      iVar2 = (iVar2 >> 0xf) - (iVar2 >> 0x1f);
      local_8 = (Regexp *)operator_new(0x28);
      Regexp(in_stack_ffffffffffffff50,(RegexpOp)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (ParseFlags)in_stack_ffffffffffffff48);
      AllocSub(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      ppRVar4 = Regexp::sub(local_8);
      for (local_64 = 0; op_00 = (RegexpOp)((ulong)in_RSI >> 0x20), local_64 < iVar2 + -1;
          local_64 = local_64 + 1) {
        pRVar5 = ConcatOrAlternate(op_00,(Regexp **)CONCAT44(in_EDX,in_ECX),nsub_00,
                                   in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
        ppRVar4[local_64] = pRVar5;
      }
      pRVar5 = ConcatOrAlternate(op_00,(Regexp **)CONCAT44(in_EDX,in_ECX),nsub_00,
                                 in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
      ppRVar4[iVar2 + -1] = pRVar5;
      if (local_40 != (undefined8 *)0x0) {
        operator_delete__(local_40);
      }
    }
  }
  return local_8;
}

Assistant:

Regexp* Regexp::ConcatOrAlternate(RegexpOp op, Regexp** sub, int nsub,
                                  ParseFlags flags, bool can_factor) {
  if (nsub == 1)
    return sub[0];

  if (nsub == 0) {
    if (op == kRegexpAlternate)
      return new Regexp(kRegexpNoMatch, flags);
    else
      return new Regexp(kRegexpEmptyMatch, flags);
  }

  Regexp** subcopy = NULL;
  if (op == kRegexpAlternate && can_factor) {
    // Going to edit sub; make a copy so we don't step on caller.
    subcopy = new Regexp*[nsub];
    memmove(subcopy, sub, nsub * sizeof sub[0]);
    sub = subcopy;
    nsub = FactorAlternation(sub, nsub, flags);
    if (nsub == 1) {
      Regexp* re = sub[0];
      delete[] subcopy;
      return re;
    }
  }

  if (nsub > kMaxNsub) {
    // Too many subexpressions to fit in a single Regexp.
    // Make a two-level tree.  Two levels gets us to 65535^2.
    int nbigsub = (nsub+kMaxNsub-1)/kMaxNsub;
    Regexp* re = new Regexp(op, flags);
    re->AllocSub(nbigsub);
    Regexp** subs = re->sub();
    for (int i = 0; i < nbigsub - 1; i++)
      subs[i] = ConcatOrAlternate(op, sub+i*kMaxNsub, kMaxNsub, flags, false);
    subs[nbigsub - 1] = ConcatOrAlternate(op, sub+(nbigsub-1)*kMaxNsub,
                                          nsub - (nbigsub-1)*kMaxNsub, flags,
                                          false);
    delete[] subcopy;
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(nsub);
  Regexp** subs = re->sub();
  for (int i = 0; i < nsub; i++)
    subs[i] = sub[i];

  delete[] subcopy;
  return re;
}